

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::GetFilenameName(string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  size_type slash_pos;
  char separators;
  string *filename_local;
  
  lVar1 = std::__cxx11::string::find_last_of((char)filename,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenameName(const std::string& filename)
{
#if defined(_WIN32) || defined(KWSYS_SYSTEMTOOLS_SUPPORT_WINDOWS_SLASHES)
  const char* separators = "/\\";
#else
  char separators = '/';
#endif
  std::string::size_type slash_pos = filename.find_last_of(separators);
  if (slash_pos != std::string::npos) {
    return filename.substr(slash_pos + 1);
  } else {
    return filename;
  }
}